

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coomatrix.h
# Opt level: O3

void __thiscall
lf::assemble::COOMatrix<double>::
MatVecMult<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
          (COOMatrix<double> *this,double alpha,Matrix<double,__1,_1,_0,__1,_1> *vec,
          Matrix<double,__1,_1,_0,__1,_1> *resvec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pTVar3;
  CoeffReturnType pdVar4;
  Scalar *pSVar5;
  ostream *poVar6;
  Triplet *trp;
  pointer pTVar7;
  stringstream ss;
  string local_218;
  string local_1f8;
  string local_1d8;
  double local_1b8;
  double local_1b0;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  if ((vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
      (long)(ulong)this->cols_) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"Vector vec size mismatch: ",0x1a);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," <-> ",5);
    std::ostream::_M_insert<long>((long)poVar6);
    paVar1 = &local_1f8.field_2;
    local_1f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"vec.size() >= cols_","");
    paVar2 = &local_218.field_2;
    local_218._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/coomatrix.h"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_1f8,&local_218,0xfd,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    local_1f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"false","");
    local_218._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/coomatrix.h"
               ,"");
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
    base::AssertionFailed(&local_1f8,&local_218,0xfd,&local_1d8);
  }
  else {
    if ((long)(ulong)this->rows_ <=
        (resvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pTVar3 = (this->triplets_).
               super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_1b0 = alpha;
      for (pTVar7 = (this->triplets_).
                    super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pTVar7 != pTVar3; pTVar7 = pTVar7 + 1
          ) {
        local_1b8 = pTVar7->m_value;
        pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)vec,
                            (long)pTVar7->m_col);
        local_1b8 = *pdVar4 * local_1b0 * local_1b8;
        pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)resvec,
                            (long)pTVar7->m_row);
        *pSVar5 = local_1b8 + *pSVar5;
      }
      return;
    }
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,"Vector result size mismatch: ",0x1d);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," <-> ",5);
    std::ostream::_M_insert<long>((long)poVar6);
    paVar1 = &local_1f8.field_2;
    local_1f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,"resvec.size() >= rows_","");
    paVar2 = &local_218.field_2;
    local_218._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/coomatrix.h"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_1f8,&local_218,0x100,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    local_1f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"false","");
    local_218._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/coomatrix.h"
               ,"");
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
    base::AssertionFailed(&local_1f8,&local_218,0x100,&local_1d8);
  }
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  abort();
}

Assistant:

void COOMatrix<SCALAR>::MatVecMult(SCALAR alpha, const VECTOR &vec,
                                   RESULTVECTOR &resvec) const {
  LF_ASSERT_MSG(vec.size() >= cols_,
                "Vector vec size mismatch: " << cols_ << " <-> " << vec.size());
  LF_ASSERT_MSG(
      resvec.size() >= rows_,
      "Vector result size mismatch: " << cols_ << " <-> " << resvec.size());
  for (const Triplet &trp : triplets_) {
    resvec[trp.row()] += trp.value() * (alpha * vec[trp.col()]);
  }
}